

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HKDF.c
# Opt level: O2

void EverCrypt_HKDF_expand
               (Spec_Hash_Definitions_hash_alg a,uint8_t *okm,uint8_t *prk,uint32_t prklen,
               uint8_t *info,uint32_t infolen,uint32_t len)

{
  undefined7 in_register_00000039;
  
  switch((int)CONCAT71(in_register_00000039,a)) {
  case 1:
    expand_sha2_256(okm,prk,prklen,info,infolen,len);
    return;
  case 2:
    expand_sha2_384(okm,prk,prklen,info,infolen,len);
    return;
  case 3:
    expand_sha2_512(okm,prk,prklen,info,infolen,len);
    return;
  case 4:
    expand_sha1(okm,prk,prklen,info,infolen,len);
    return;
  default:
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_HKDF.c"
            ,0x1a0);
    exit(0xfd);
  case 6:
    expand_blake2s(okm,prk,prklen,info,infolen,len);
    return;
  case 7:
    expand_blake2b(okm,prk,prklen,info,infolen,len);
    return;
  }
}

Assistant:

void
EverCrypt_HKDF_expand(
  Spec_Hash_Definitions_hash_alg a,
  uint8_t *okm,
  uint8_t *prk,
  uint32_t prklen,
  uint8_t *info,
  uint32_t infolen,
  uint32_t len
)
{
  switch (a)
  {
    case Spec_Hash_Definitions_SHA1:
      {
        expand_sha1(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        expand_sha2_256(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        expand_sha2_384(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        expand_sha2_512(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        expand_blake2s(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        expand_blake2b(okm, prk, prklen, info, infolen, len);
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}